

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O0

bool test_window2<56>(void)

{
  uint32_t c;
  uint32_t b;
  uint32_t a;
  int count;
  int start;
  keytype k;
  int j;
  int reps;
  int nbytes;
  Rand r;
  uint32_t in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  uint32_t in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int count_00;
  int iVar1;
  
  Rand::Rand((Rand *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
  count_00 = 0;
  while (count_00 < 10000) {
    iVar1 = count_00;
    if (count_00 % 1000 == 0) {
      printf(".");
    }
    Rand::rand_p((Rand *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                 (void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffd4);
    for (in_stack_ffffffffffffffd8 = 0; in_stack_ffffffffffffffd8 < 0x38;
        in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffd8 + 1) {
      for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < 0x20;
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
        in_stack_ffffffffffffffd0 =
             window1((void *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,count_00);
        in_stack_ffffffffffffffcc =
             window8(&stack0xffffffffffffffdd,7,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4)
        ;
        in_stack_ffffffffffffffc8 =
             window((void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),count_00,
                    in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        assert(in_stack_ffffffffffffffd0 == in_stack_ffffffffffffffcc);
        assert(in_stack_ffffffffffffffd0 == in_stack_ffffffffffffffc8);
      }
    }
    count_00 = iVar1 + 1;
  }
  printf("PASS %d\n",0x38);
  return true;
}

Assistant:

bool test_window2 ( void )
{
  Rand r(83874);

  struct keytype
  {
    uint8_t bytes[nbits/8];
  };

  int nbytes = nbits / 8;
  int reps = 10000;

  for(int j = 0; j < reps; j++)
  {
    if(j % (reps/10) == 0) printf(".");

    keytype k;

    r.rand_p(&k,nbytes);

    for(int start = 0; start < nbits; start++)
    {
      for(int count = 0; count < 32; count++)
      {
        uint32_t a = window1(&k,nbytes,start,count);
        uint32_t b = window8(&k,nbytes,start,count);
        uint32_t c = window(&k,nbytes,start,count);

        assert(a == b);
        assert(a == c);
      }
    }
  }

  printf("PASS %d\n",nbits);

  return true;
}